

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void LemonAtExit(void)

{
  long lVar1;
  
  if (0 < made_files_count) {
    lVar1 = 0;
    do {
      if (successful_exit == 0) {
        remove(made_files[lVar1]);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < made_files_count);
  }
  free(made_files);
  made_files_count = 0;
  made_files = (char **)0x0;
  return;
}

Assistant:

static void LemonAtExit(void)
{
    /* if we failed, delete (most) files we made, to unconfuse build tools. */
    int i;
    for (i = 0; i < made_files_count; i++) {
        if (!successful_exit) {
            remove(made_files[i]);
        }
    }
    free(made_files);
    made_files_count = 0;
    made_files = NULL;
}